

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O1

cs_err cs_regs_access(csh ud,cs_insn *insn,uint16_t *regs_read,uint8_t *regs_read_count,
                     uint16_t *regs_write,uint8_t *regs_write_count)

{
  code *pcVar1;
  
  if (ud == 0) {
    return ~CS_ERR_OK;
  }
  if (*(int *)(ud + 0x60) != 0) {
    if (insn->id == 0) {
      *(undefined4 *)(ud + 0x50) = 0xb;
      return CS_ERR_SKIPDATA;
    }
    if (insn->detail != (cs_detail *)0x0) {
      pcVar1 = *(code **)(ud + 0xa8);
      if (pcVar1 != (code *)0x0) {
        (*pcVar1)(insn,regs_read,regs_read_count,regs_write,regs_write_count,regs_write_count,pcVar1
                 );
        return CS_ERR_OK;
      }
      *(undefined4 *)(ud + 0x50) = 2;
      return CS_ERR_ARCH;
    }
  }
  *(undefined4 *)(ud + 0x50) = 7;
  return CS_ERR_DETAIL;
}

Assistant:

CAPSTONE_API cs_regs_access(csh ud, const cs_insn *insn,
		cs_regs regs_read, uint8_t *regs_read_count,
		cs_regs regs_write, uint8_t *regs_write_count)
{
	struct cs_struct *handle;

	if (!ud)
		return -1;

	handle = (struct cs_struct *)(uintptr_t)ud;

#ifdef CAPSTONE_DIET
	// This API does not work in DIET mode
	handle->errnum = CS_ERR_DIET;
	return CS_ERR_DIET;
#else
	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return CS_ERR_DETAIL;
	}

	if (!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return CS_ERR_SKIPDATA;
	}

	if (!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return CS_ERR_DETAIL;
	}

	if (handle->reg_access) {
		handle->reg_access(insn, regs_read, regs_read_count, regs_write, regs_write_count);
	} else {
		// this arch is unsupported yet
		handle->errnum = CS_ERR_ARCH;
		return CS_ERR_ARCH;
	}

	return CS_ERR_OK;
#endif
}